

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O0

shared_ptr<LNode> __thiscall LParser::reduce_30(LParser *this)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_ESI;
  shared_ptr<LNode> sVar2;
  shared_ptr<LNode> local_130;
  shared_ptr<LNode> local_120;
  shared_ptr<LNode> local_110;
  LNodeIEStmt local_100;
  undefined1 local_cc [12];
  shared_ptr<LNodeData<LNodeIEStmt>_> r;
  shared_ptr<LNode> local_a8;
  shared_ptr<LNode> local_98;
  shared_ptr<LNode> local_88;
  undefined1 local_78 [8];
  shared_ptr<LNode> else_branch;
  shared_ptr<LNode> stmt1;
  shared_ptr<LNode> then_branch;
  undefined1 local_38 [8];
  shared_ptr<LNode> stmt0;
  shared_ptr<LNode> condition;
  LParser *this_local;
  
  get_node((LParser *)&stmt0.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
           in_ESI);
  get_node((LParser *)local_38,in_ESI);
  get_node((LParser *)&stmt1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
           in_ESI);
  get_node((LParser *)&else_branch.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ,in_ESI);
  get_node((LParser *)local_78,in_ESI);
  std::shared_ptr<LNode>::shared_ptr
            (&local_98,
             (shared_ptr<LNode> *)
             &stmt1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  lnode_get<LNodeChildren>(&local_88);
  peVar1 = std::
           __shared_ptr_access<LNodeData<LNodeChildren>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<LNodeData<LNodeChildren>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_88);
  LNodeChildren::push_front(&peVar1->value,(shared_ptr<LNode> *)local_38);
  std::shared_ptr<LNodeData<LNodeChildren>_>::~shared_ptr
            ((shared_ptr<LNodeData<LNodeChildren>_> *)&local_88);
  std::shared_ptr<LNode>::~shared_ptr(&local_98);
  std::shared_ptr<LNode>::shared_ptr
            ((shared_ptr<LNode> *)
             &r.super___shared_ptr<LNodeData<LNodeIEStmt>,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr<LNode> *)local_78);
  lnode_get<LNodeChildren>(&local_a8);
  peVar1 = std::
           __shared_ptr_access<LNodeData<LNodeChildren>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<LNodeData<LNodeChildren>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_a8);
  LNodeChildren::push_front
            (&peVar1->value,
             (shared_ptr<LNode> *)
             &else_branch.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<LNodeData<LNodeChildren>_>::~shared_ptr
            ((shared_ptr<LNodeData<LNodeChildren>_> *)&local_a8);
  std::shared_ptr<LNode>::~shared_ptr
            ((shared_ptr<LNode> *)
             &r.super___shared_ptr<LNodeData<LNodeIEStmt>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_cc._0_4_ = 0x30;
  std::shared_ptr<LNode>::shared_ptr
            (&local_110,
             (shared_ptr<LNode> *)
             &stmt0.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<LNode>::shared_ptr
            (&local_120,
             (shared_ptr<LNode> *)
             &stmt1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<LNode>::shared_ptr(&local_130,(shared_ptr<LNode> *)local_78);
  LNodeIEStmt::LNodeIEStmt(&local_100,&local_110,&local_120,&local_130);
  std::make_shared<LNodeData<LNodeIEStmt>,LNodeType,LNodeIEStmt>
            ((LNodeType *)(local_cc + 4),(LNodeIEStmt *)local_cc);
  LNodeIEStmt::~LNodeIEStmt(&local_100);
  std::shared_ptr<LNode>::~shared_ptr(&local_130);
  std::shared_ptr<LNode>::~shared_ptr(&local_120);
  std::shared_ptr<LNode>::~shared_ptr(&local_110);
  std::shared_ptr<LNode>::shared_ptr<LNodeData<LNodeIEStmt>,void>
            ((shared_ptr<LNode> *)this,(shared_ptr<LNodeData<LNodeIEStmt>_> *)(local_cc + 4));
  std::shared_ptr<LNodeData<LNodeIEStmt>_>::~shared_ptr
            ((shared_ptr<LNodeData<LNodeIEStmt>_> *)(local_cc + 4));
  std::shared_ptr<LNode>::~shared_ptr((shared_ptr<LNode> *)local_78);
  std::shared_ptr<LNode>::~shared_ptr
            ((shared_ptr<LNode> *)
             &else_branch.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<LNode>::~shared_ptr
            ((shared_ptr<LNode> *)
             &stmt1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<LNode>::~shared_ptr((shared_ptr<LNode> *)local_38);
  std::shared_ptr<LNode>::~shared_ptr
            ((shared_ptr<LNode> *)
             &stmt0.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar2.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  sVar2.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<LNode>)sVar2.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<LNode> LParser::reduce_30() {
    // IEStmt : IF Expr Brs THEN Brs NIEStmt NIEStmts ELSE Brs Stmt Stmts END Brs
    auto condition = this->get_node(12);
    auto stmt0 = this->get_node(8);
    auto then_branch = this->get_node(7);
    auto stmt1 = this->get_node(4);
    auto else_branch = this->get_node(3);
    lnode_get<LNodeChildren>(then_branch)->value.push_front(stmt0);
    lnode_get<LNodeChildren>(else_branch)->value.push_front(stmt1);
    auto r = std::make_shared<LNodeData<LNodeIEStmt>>(
            LNodeType::IEStmt,
            LNodeIEStmt(condition, then_branch, else_branch)
    );
    return r;
}